

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

uint xkb_mask_modifier(XkbDescPtr xkb,char *name)

{
  int iVar1;
  char *__s2;
  char *modStr;
  wchar_t i;
  uint mask;
  char *name_local;
  XkbDescPtr xkb_local;
  
  modStr._4_4_ = 0;
  _i = name;
  name_local = (char *)xkb;
  iVar1 = strcmp(name,"Caps Lock");
  if (iVar1 == 0) {
    xkb_local._4_4_ = 2;
  }
  else {
    for (modStr._0_4_ = 0; modStr._4_4_ == 0 && (int)modStr < 0x10; modStr._0_4_ = (int)modStr + 1)
    {
      if ((*(long *)(*(long *)(name_local + 0x30) + 0x28 + (long)(int)modStr * 8) != 0) &&
         (__s2 = (char *)XGetAtomName(*(undefined8 *)name_local,
                                      *(undefined8 *)
                                       (*(long *)(name_local + 0x30) + 0x28 + (long)(int)modStr * 8)
                                     ), __s2 != (char *)0x0)) {
        iVar1 = strcmp(_i,__s2);
        if (iVar1 == 0) {
          XkbVirtualModsToReal(name_local,1 << ((byte)(int)modStr & 0x1f),(long)&modStr + 4);
        }
        XFree(__s2);
      }
    }
    xkb_local._4_4_ = 0;
  }
  return xkb_local._4_4_;
}

Assistant:

static unsigned int xkb_mask_modifier( XkbDescPtr xkb, const char *name )
{
	unsigned int mask=0;
	
	if (streq(name, "Caps Lock")) return 2;
	
	for (int i = 0; (!mask) && (i < XkbNumVirtualMods); i++ ) {
		char* modStr;

		/* Avoid BadAtom errors:  skip elements with a null atom. */
		if (xkb->names->vmods[i] == None) {
		        continue;
		}
		modStr = XGetAtomName( xkb->dpy, xkb->names->vmods[i] );
		if (modStr) {
			if (streq(name, modStr))
				XkbVirtualModsToReal( xkb, 1U << i, &mask );

			XFree(modStr);
		}
	}
	return 0;
}